

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

Image * __thiscall
sfc::Image::crop(Image *__return_storage_ptr__,Image *this,uint x,uint y,uint crop_width,
                uint crop_height,Mode mode)

{
  channel_vec_t *pcVar1;
  _Rb_tree_header *p_Var2;
  pointer puVar3;
  pointer puVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  rgba_vec_t rgba_v;
  rgba_vec_t local_90;
  channel_vec_t *local_78;
  _Base_ptr local_70;
  size_t local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  local_70 = &(__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_indexed_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->_indexed_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->_indexed_data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_70;
  (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_70
  ;
  (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&__return_storage_ptr__->_palette,&this->_palette);
  pcVar1 = &__return_storage_ptr__->_data;
  __return_storage_ptr__->_width = crop_width;
  __return_storage_ptr__->_height = crop_height;
  __return_storage_ptr__->_src_coord_x = x;
  __return_storage_ptr__->_src_coord_y = y;
  uVar7 = crop_height * crop_width;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pcVar1,(ulong)(uVar7 * 4));
  puVar3 = (__return_storage_ptr__->_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (__return_storage_ptr__->_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != puVar4) {
    uVar8 = 0;
    do {
      *(uint *)((pcVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start + uVar8) =
           (uint)(mode != gb) * 0x1000000 + -0x1000000;
      uVar8 = uVar8 + 4;
    } while (uVar8 < (ulong)((long)puVar3 - (long)puVar4));
  }
  uVar9 = this->_width;
  if (x <= uVar9) {
    uVar11 = this->_height;
    if (y <= uVar11) {
      uVar5 = uVar9 - x;
      if (x + crop_width <= uVar9) {
        uVar5 = crop_width;
      }
      uVar9 = uVar11 - y;
      if (y + crop_height <= uVar11) {
        uVar9 = crop_height;
      }
      local_78 = pcVar1;
      if (uVar9 != 0) {
        local_68 = (size_t)(uVar5 * 4);
        iVar10 = 0;
        uVar11 = 0;
        do {
          memcpy((__return_storage_ptr__->_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + __return_storage_ptr__->_width * iVar10,
                 (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + ((y + uVar11) * this->_width + x) * 4,
                 local_68);
          uVar11 = uVar11 + 1;
          iVar10 = iVar10 + 4;
        } while (uVar11 < uVar9);
      }
      pcVar1 = local_78;
      if (((this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish !=
           (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start) &&
         (std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&__return_storage_ptr__->_indexed_data,(ulong)uVar7), uVar9 != 0)) {
        uVar7 = 0;
        do {
          memcpy((__return_storage_ptr__->_indexed_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + __return_storage_ptr__->_width * uVar7,
                 (this->_indexed_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + ((y + uVar7) * this->_width + x),(ulong)uVar5);
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar9);
      }
      to_rgba(&local_90,pcVar1);
      std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
      set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_60
                 ,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   )local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      p_Var6 = local_70;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::clear(&(__return_storage_ptr__->_colors)._M_t);
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var2 = &local_60._M_impl.super__Rb_tree_header;
        (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_60._M_impl.super__Rb_tree_header._M_header._M_color;
        (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var6;
        (__return_storage_ptr__->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count =
             local_60._M_impl.super__Rb_tree_header._M_node_count;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_60);
      if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start == (uint *)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
  }
  if ((this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&__return_storage_ptr__->_indexed_data,(ulong)uVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::crop(unsigned x, unsigned y, unsigned crop_width, unsigned crop_height, Mode mode) const {
  Image img;
  img._palette = _palette;
  img._width = crop_width;
  img._height = crop_height;
  img._src_coord_x = x;
  img._src_coord_y = y;
  img._data.resize(crop_width * crop_height * 4);

  uint32_t fillval = mode == Mode::gb ? 0xff000000 : transparent_color;
  size_t fillsize = img._data.size();
  for (size_t i = 0; i < fillsize; i += 4)
    std::memcpy(img._data.data() + i, &fillval, sizeof(fillval));

  if (x > _width || y > _height) {
    // Crop outside source image: return empty
    if (_indexed_data.size())
      img._indexed_data.resize(crop_width * crop_height);
    return img;
  }

  unsigned blit_width = (x + crop_width > _width) ? _width - x : crop_width;
  unsigned blit_height = (y + crop_height > _height) ? _height - y : crop_height;

  for (unsigned iy = 0; iy < blit_height; ++iy) {
    std::memcpy(&img._data[iy * img._width * 4], &_data[(x * 4) + ((iy + y) * _width * 4)], blit_width * 4);
  }

  if (_indexed_data.size()) {
    img._indexed_data.resize(crop_width * crop_height);
    for (unsigned iy = 0; iy < blit_height; ++iy) {
      std::memcpy(&img._indexed_data[iy * img._width], &_indexed_data[x + ((iy + y) * _width)], blit_width);
    }
  }

  auto rgba_v = img.rgba_data();
  img._colors = rgba_set_t(rgba_v.begin(), rgba_v.end());
  return img;
}